

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O2

void __thiscall picobench::runner::run_benchmarks(runner *this,int random_seed)

{
  pointer ppbVar1;
  pointer prVar2;
  pointer psVar3;
  pointer puVar4;
  benchmark_impl *pbVar5;
  pointer piVar6;
  ostream *poVar7;
  pointer piVar8;
  pthread_t __th;
  byte bVar9;
  pointer ppbVar10;
  ulong uVar11;
  ulong uVar12;
  rsuite *suite;
  pointer prVar13;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *b;
  pointer puVar14;
  int i;
  int iVar15;
  pointer puVar16;
  vector<int,_std::allocator<int>_> *pvVar17;
  vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> benchmarks;
  int iters;
  undefined4 uStack_13b4;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  
  if (random_seed == -1) {
    std::random_device::random_device((random_device *)&iters);
    random_seed = std::random_device::_M_getval();
    std::random_device::~random_device((random_device *)&iters);
  }
  uVar12 = (ulong)(long)random_seed % 0x7fffffff +
           (ulong)((ulong)(long)random_seed % 0x7fffffff == 0);
  benchmarks.
  super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  benchmarks.
  super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  benchmarks.
  super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prVar2 = (this->super_registry)._suites.
           super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (prVar13 = (this->super_registry)._suites.
                 super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppbVar1 = benchmarks.
                super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                ._M_impl.super__Vector_impl_data._M_finish, prVar13 != prVar2; prVar13 = prVar13 + 1
      ) {
    puVar14 = (prVar13->benchmarks).
              super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = 0;
    puVar4 = (prVar13->benchmarks).
             super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (puVar16 = puVar4, puVar16 != puVar14) {
      _iters = (puVar16->_M_t).
               super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
               .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
      psVar3 = *(pointer *)
                &(((benchmark_impl *)_iters)->_states).
                 super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl;
      if (*(pointer *)
           ((long)&(((benchmark_impl *)_iters)->_states).
                   super__Vector_base<picobench::state,_std::allocator<picobench::state>_> + 8) !=
          psVar3) {
        *(pointer *)
         ((long)&(((benchmark_impl *)_iters)->_states).
                 super__Vector_base<picobench::state,_std::allocator<picobench::state>_> + 8) =
             psVar3;
        _iters = (puVar16->_M_t).
                 super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                 .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
      }
      std::vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>>::
      emplace_back<picobench::benchmark_impl*>
                ((vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>> *)
                 &benchmarks,(benchmark_impl **)&iters);
      bVar9 = bVar9 | (((puVar16->_M_t).
                        super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                        .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->
                      super_benchmark)._baseline;
      for (puVar14 = puVar16 + 1; puVar4 = puVar16 + 1,
          puVar14 !=
          (prVar13->benchmarks).
          super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; puVar14 = puVar14 + 1) {
        if ((((puVar16->_M_t).
              super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
              .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->
            super_benchmark)._proc ==
            (((puVar14->_M_t).
              super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
              .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->
            super_benchmark)._proc) {
          poVar7 = std::operator<<(this->_stdwarn,"Warning: ");
          poVar7 = std::operator<<(poVar7,(((puVar16->_M_t).
                                            super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                                            .
                                            super__Head_base<0UL,_picobench::benchmark_impl_*,_false>
                                           ._M_head_impl)->super_benchmark)._name);
          poVar7 = std::operator<<(poVar7," and ");
          poVar7 = std::operator<<(poVar7,(((puVar14->_M_t).
                                            super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                                            .
                                            super__Head_base<0UL,_picobench::benchmark_impl_*,_false>
                                           ._M_head_impl)->super_benchmark)._name);
          std::operator<<(poVar7," are benchmarks of the same function.\n");
        }
      }
    }
    if (((bVar9 & 1) == 0) &&
       (puVar4 = (prVar13->benchmarks).
                 super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, puVar4 != puVar14)) {
      (((puVar4->_M_t).
        super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
        .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->super_benchmark).
      _baseline = true;
    }
  }
  for (ppbVar10 = benchmarks.
                  super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppbVar10 != ppbVar1;
      ppbVar10 = ppbVar10 + 1) {
    pbVar5 = *ppbVar10;
    pvVar17 = &(pbVar5->super_benchmark)._state_iterations;
    if ((pbVar5->super_benchmark)._state_iterations.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pbVar5->super_benchmark)._state_iterations.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pvVar17 = &this->_default_state_iterations;
    }
    iVar15 = (pbVar5->super_benchmark)._samples;
    if (iVar15 == 0) {
      iVar15 = this->_default_samples;
      (pbVar5->super_benchmark)._samples = iVar15;
    }
    std::vector<picobench::state,_std::allocator<picobench::state>_>::reserve
              (&pbVar5->_states,
               (long)iVar15 *
               ((long)(pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2));
    piVar6 = (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar8 = (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar6; piVar8 = piVar8 + 1) {
      iters = *piVar8;
      for (iVar15 = 0; iVar15 < (pbVar5->super_benchmark)._samples; iVar15 = iVar15 + 1) {
        uVar12 = (uVar12 * 0xbc8f) % 0x7fffffff;
        psVar3 = (pbVar5->_states).
                 super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<picobench::state,std::allocator<picobench::state>>::
        _M_emplace_aux<int&,unsigned_long&>
                  ((vector<picobench::state,std::allocator<picobench::state>> *)&pbVar5->_states,
                   psVar3 + uVar12 % (((long)(pbVar5->_states).
                                             super__Vector_base<picobench::state,_std::allocator<picobench::state>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)psVar3) / 0x28 + 1U),&iters,
                   &(pbVar5->super_benchmark)._user_data);
      }
    }
    (pbVar5->_istate)._M_current =
         (pbVar5->_states).super__Vector_base<picobench::state,_std::allocator<picobench::state>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  local_1350 = 0;
  uStack_1348 = 0;
  local_1360 = 0;
  uStack_1358 = 0;
  local_1370 = 0;
  uStack_1368 = 0;
  local_1380 = 0;
  uStack_1378 = 0;
  local_1390 = 0;
  uStack_1388 = 0;
  local_13a0 = 0;
  uStack_1398 = 0;
  local_13b0 = (_func_result_type_void_ptr *)0x0;
  uStack_13a8 = 0;
  local_1340 = 0;
  _iters = (void *)0x1;
  __th = pthread_self();
  pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&iters);
  while (ppbVar1 = benchmarks.
                   super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        benchmarks.
        super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        benchmarks.
        super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    uVar12 = (uVar12 * 0xbc8f) % 0x7fffffff;
    uVar11 = uVar12 % (ulong)((long)benchmarks.
                                    super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)benchmarks.
                                    super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    (*(benchmarks.
       super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar11]->super_benchmark)._proc)
              ((benchmarks.
                super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar11]->_istate)._M_current);
    ppbVar1 = ppbVar1 + uVar11;
    ((*ppbVar1)->_istate)._M_current = ((*ppbVar1)->_istate)._M_current + 1;
    if (((*ppbVar1)->_istate)._M_current ==
        ((*ppbVar1)->_states).
        super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppbVar10 = ppbVar1 + 1;
      if (ppbVar10 !=
          benchmarks.
          super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        memmove(ppbVar1,ppbVar10,
                (long)benchmarks.
                      super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppbVar10);
      }
      benchmarks.
      super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           benchmarks.
           super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
  }
  std::_Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::
  ~_Vector_base(&benchmarks.
                 super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
               );
  return;
}

Assistant:

void run_benchmarks(int random_seed = -1)
    {
        I_PICOBENCH_ASSERT(_error == no_error && _should_run);

        if (random_seed == -1)
        {
            random_seed = int(std::random_device()());
        }

        std::minstd_rand rnd(random_seed);

        // vector of all benchmarks
        std::vector<benchmark_impl*> benchmarks;
        for (auto& suite : _suites)
        {
            // also identify a baseline in this loop
            // if there is no explicit one, set the first one as a baseline
            bool found_baseline = false;
            for (auto irb = suite.benchmarks.begin(); irb != suite.benchmarks.end(); ++irb)
            {
                auto& rb = *irb;
                rb->_states.clear(); // clear states so we can safely call run_benchmarks multiple times
                benchmarks.push_back(rb.get());
                if (rb->_baseline)
                {
                    found_baseline = true;
                }

#if !defined(PICOBENCH_STD_FUNCTION_BENCHMARKS)
                // check for same func
                for (auto ib = irb+1; ib != suite.benchmarks.end(); ++ib)
                {
                    auto& b = *ib;
                    if (rb->_proc == b->_proc)
                    {
                        *_stdwarn << "Warning: " << rb->name() << " and " << b->name()
                                 << " are benchmarks of the same function.\n";
                    }
                }
#endif
            }

            if (!found_baseline && !suite.benchmarks.empty())
            {
                suite.benchmarks.front()->_baseline = true;
            }
        }

        // initialize benchmarks
        for (auto b : benchmarks)
        {
            const std::vector<int>& state_iterations =
                b->_state_iterations.empty() ?
                _default_state_iterations :
                b->_state_iterations;

            if (b->_samples == 0)
                b->_samples = _default_samples;

            b->_states.reserve(state_iterations.size() * size_t(b->_samples));

            // fill states while random shuffling them
            for (auto iters : state_iterations)
            {
                for (int i = 0; i < b->_samples; ++i)
                {
                    auto index = rnd() % (b->_states.size() + 1);
                    auto pos = b->_states.begin() + long(index);
                    b->_states.emplace(pos, iters, b->_user_data);
                }
            }

            b->_istate = b->_states.begin();
        }

#if !defined(PICOBENCH_DONT_BIND_TO_ONE_CORE)
        // set thread affinity to first cpu
        // so the high resolution clock doesn't miss cycles
        {
#if defined(_WIN32)
        SetThreadAffinityMask(GetCurrentThread(), 1);
#elif defined(__APPLE__)
        thread_affinity_policy_data_t policy = {0};
        thread_policy_set(
            pthread_mach_thread_np(pthread_self()),
            THREAD_AFFINITY_POLICY,
            (thread_policy_t)&policy, 1);
#else
        cpu_set_t cpuset;
        CPU_ZERO(&cpuset);
        CPU_SET(0, &cpuset);

        pthread_t cur = pthread_self();
        pthread_setaffinity_np(cur, sizeof(cpu_set_t), &cpuset);
#endif
        }
#endif

        // we run a random benchmark from it incrementing _istate for each
        // when _istate reaches _states.end(), we erase the benchmark
        // when the vector becomes empty, we're done
        while (!benchmarks.empty())
        {
            auto i = benchmarks.begin() + long(rnd() % benchmarks.size());
            auto& b = *i;

            b->_proc(*b->_istate);

            ++b->_istate;

            if (b->_istate == b->_states.end())
            {
                benchmarks.erase(i);
            }
        }
    }